

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O1

uint32 WAsmJs::ConvertOffset(uint32 offset,uint32 fromSize,uint32 toSize)

{
  ulong uVar1;
  
  uVar1 = (ulong)offset;
  if (fromSize != toSize) {
    uVar1 = (ulong)toSize;
    uVar1 = (-uVar1 & ((ulong)fromSize * (ulong)offset + uVar1) - 1) / uVar1;
    if (uVar1 >> 0x20 != 0) {
      Math::DefaultOverflowPolicy();
    }
  }
  return (uint32)uVar1;
}

Assistant:

uint32 ConvertOffset(uint32 offset, uint32 fromSize, uint32 toSize)
    {
        if (fromSize == toSize)
        {
            return offset;
        }
        uint64 tmp = (uint64)offset * (uint64)fromSize;
        tmp = Math::Align<uint64>(tmp, toSize);
        tmp /= (uint64)toSize;
        if (tmp > (uint64)UINT32_MAX)
        {
            Math::DefaultOverflowPolicy();
        }
        return (uint32)tmp;
    }